

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O0

void show_quiver(wchar_t mode,item_tester tester)

{
  wchar_t local_20;
  wchar_t local_1c;
  wchar_t last_slot;
  wchar_t i;
  item_tester tester_local;
  wchar_t mode_local;
  
  local_20 = L'\xffffffff';
  wipe_obj_list();
  for (local_1c = L'\0'; local_1c < (int)(uint)z_info->quiver_size; local_1c = local_1c + L'\x01') {
    if (player->upkeep->quiver[local_1c] != (object *)0x0) {
      local_20 = local_1c;
    }
  }
  build_obj_list(local_20,player->upkeep->quiver,tester,mode);
  num_head = L'\0';
  show_obj_list(mode);
  return;
}

Assistant:

void show_quiver(int mode, item_tester tester)
{
	int i, last_slot = -1;

	/* Initialize */
	wipe_obj_list();

	/* Find the last occupied quiver slot */
	for (i = 0; i < z_info->quiver_size; i++)
		if (player->upkeep->quiver[i] != NULL) last_slot = i;

	/* Build the object list */
	build_obj_list(last_slot, player->upkeep->quiver, tester, mode);

	/* Display the object list */
	num_head = 0;
	show_obj_list(mode);
}